

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_accessors.c
# Opt level: O3

uint32_t aec_get_msb_16(aec_stream *strm)

{
  ushort uVar1;
  
  uVar1 = *(ushort *)strm->next_in;
  strm->next_in = (uchar *)((long)strm->next_in + 2);
  strm->avail_in = strm->avail_in - 2;
  return (uint32_t)(ushort)(uVar1 << 8 | uVar1 >> 8);
}

Assistant:

uint32_t aec_get_msb_16(struct aec_stream *strm)
{
    uint32_t data;

    data = ((uint32_t)strm->next_in[0] << 8)
        | (uint32_t)strm->next_in[1];

    strm->next_in += 2;
    strm->avail_in -= 2;
    return data;
}